

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XorHandler.h
# Opt level: O2

bool __thiscall TCLAP::XorHandler::contains(XorHandler *this,Arg *a)

{
  pointer pvVar1;
  Arg *pAVar2;
  ulong uVar3;
  int i;
  ulong uVar4;
  pointer ppAVar5;
  
  pvVar1 = (this->_orList).
           super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->_orList).
                 super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18;
  for (uVar4 = 0; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    ppAVar5 = *(pointer *)
               &pvVar1[uVar4].super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>.
                _M_impl;
    while (ppAVar5 !=
           *(pointer *)
            ((long)&pvVar1[uVar4].super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>.
                    _M_impl + 8)) {
      pAVar2 = *ppAVar5;
      ppAVar5 = ppAVar5 + 1;
      if (pAVar2 == a) goto LAB_0010e736;
    }
  }
LAB_0010e736:
  return uVar4 < uVar3;
}

Assistant:

inline bool XorHandler::contains( const Arg* a )
{
	for ( int i = 0; static_cast<unsigned int>(i) < _orList.size(); i++ )
		for ( ArgVectorIterator it = _orList[i].begin(); 
			  it != _orList[i].end(); 
			  it++ )	
			if ( a == (*it) )
				return true;

	return false;
}